

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O0

void __thiscall AudioFileRenderer::~AudioFileRenderer(AudioFileRenderer *this)

{
  MidiParser *pMVar1;
  long lVar2;
  MidiParser *this_00;
  int in_ESI;
  AudioFileRenderer *this_local;
  
  *(undefined ***)this = &PTR_metaObject_0020de28;
  stop(this);
  if (((this->realtimeMode & 1U) == 0) && ((this->audioRenderer).synth != (QSynth *)0x0)) {
    QSynth::close((this->audioRenderer).synth,in_ESI);
    if ((this->audioRenderer).audioStream != (AudioFileWriterStream *)0x0) {
      (*(((this->audioRenderer).audioStream)->super_AudioStream)._vptr_AudioStream[4])();
    }
  }
  pMVar1 = this->parsers;
  if (pMVar1 != (MidiParser *)0x0) {
    lVar2 = *(long *)&pMVar1[-1].division;
    this_00 = pMVar1 + lVar2;
    while (pMVar1 != this_00) {
      this_00 = this_00 + -1;
      MidiParser::~MidiParser(this_00);
    }
    operator_delete__(&pMVar1[-1].division,lVar2 * 0x40 + 8);
  }
  if (this->buffer != (qint16 *)0x0) {
    operator_delete__(this->buffer);
  }
  QString::~QString(&this->outFileName);
  QThread::~QThread(&this->super_QThread);
  return;
}

Assistant:

AudioFileRenderer::~AudioFileRenderer() {
	stop();
	if (!realtimeMode && audioRenderer.synth != NULL) {
		audioRenderer.synth->close();
		delete audioRenderer.synth;
	}
	delete[] parsers;
	delete[] buffer;
}